

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

bool __thiscall
capnp::_::SegmentReader::checkObject(SegmentReader *this,word *start,WordCountN<31> size)

{
  word *a;
  ulong uVar1;
  size_t sVar2;
  unsigned_long uVar3;
  bool local_39;
  ptrdiff_t startOffset;
  WordCountN<31> size_local;
  word *start_local;
  SegmentReader *this_local;
  
  a = kj::ArrayPtr<const_capnp::word>::begin(&this->ptr);
  uVar1 = intervalLength<capnp::word>(a,start,0x1fffffff);
  sVar2 = kj::ArrayPtr<const_capnp::word>::size(&this->ptr);
  uVar3 = bounded<unsigned_long>(sVar2);
  if (uVar3 < uVar1) {
    abortCheckObjectFault();
  }
  sVar2 = kj::ArrayPtr<const_capnp::word>::size(&this->ptr);
  uVar3 = bounded<unsigned_long>(sVar2);
  local_39 = false;
  if (uVar1 + size <= uVar3) {
    local_39 = ReadLimiter::canRead(this->readLimiter,(ulong)size,this->arena);
  }
  return local_39;
}

Assistant:

inline bool SegmentReader::checkObject(const word* start, WordCountN<31> size) {
  auto startOffset = intervalLength(ptr.begin(), start, MAX_SEGMENT_WORDS);
#ifdef KJ_DEBUG
  if (startOffset > bounded(ptr.size()) * WORDS) {
    abortCheckObjectFault();
  }
#endif
  return startOffset + size <= bounded(ptr.size()) * WORDS &&
      readLimiter->canRead(size, arena);
}